

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.hpp
# Opt level: O3

ShaderCodeBufferDesc * __thiscall
Diligent::ShaderResourcesGL::GetUniformBufferDesc(ShaderResourcesGL *this,Uint32 Index)

{
  void *pvVar1;
  char (*in_R8) [19];
  string msg;
  Uint32 local_2c;
  string local_28;
  
  local_2c = Index;
  if (Index < this->m_NumUniformBuffers) {
    pvVar1 = (this->m_UBReflectionBuffer)._M_t.
             super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
             _M_t.
             super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
             .super__Head_base<0UL,_void_*,_false>._M_head_impl;
    if (pvVar1 != (void *)0x0) {
      return (ShaderCodeBufferDesc *)((long)pvVar1 + (ulong)Index * 0x10);
    }
    FormatString<char[128]>
              (&local_28,
               (char (*) [128])
               "Uniform buffer reflection information is not loaded. Please set the LoadConstantBufferReflection flag when creating the shader."
              );
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetUniformBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x159);
  }
  else {
    FormatString<char[23],unsigned_int,char[19]>
              (&local_28,(Diligent *)"Uniform buffer index (",(char (*) [23])&local_2c,
               (uint *)") is out of range.",in_R8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetUniformBufferDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourcesGL.hpp"
               ,0x153);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return (ShaderCodeBufferDesc *)0x0;
}

Assistant:

const ShaderCodeBufferDesc* GetUniformBufferDesc(Uint32 Index) const
    {
        if (Index >= GetNumUniformBuffers())
        {
            UNEXPECTED("Uniform buffer index (", Index, ") is out of range.");
            return nullptr;
        }

        if (!m_UBReflectionBuffer)
        {
            UNEXPECTED("Uniform buffer reflection information is not loaded. Please set the LoadConstantBufferReflection flag when creating the shader.");
            return nullptr;
        }

        return reinterpret_cast<const ShaderCodeBufferDesc*>(m_UBReflectionBuffer.get()) + Index;
    }